

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O0

ssize_t nghttp2_bufs_remove(nghttp2_bufs *bufs,uint8_t **out)

{
  undefined1 local_68 [8];
  nghttp2_buf resbuf;
  uint8_t *res;
  nghttp2_buf *buf;
  nghttp2_buf_chain *chain;
  size_t len;
  uint8_t **out_local;
  nghttp2_bufs *bufs_local;
  
  chain = (nghttp2_buf_chain *)0x0;
  for (buf = (nghttp2_buf *)bufs->head; buf != (nghttp2_buf *)0x0; buf = (nghttp2_buf *)buf->begin)
  {
    chain = (nghttp2_buf_chain *)(((long)buf->mark - (long)buf->last) + (long)chain);
  }
  if (chain == (nghttp2_buf_chain *)0x0) {
    bufs_local = (nghttp2_bufs *)0x0;
  }
  else {
    resbuf.mark = (uint8_t *)nghttp2_mem_malloc(bufs->mem,(size_t)chain);
    if (resbuf.mark == (uint8_t *)0x0) {
      bufs_local = (nghttp2_bufs *)0xfffffffffffffc7b;
    }
    else {
      nghttp2_buf_wrap_init((nghttp2_buf *)local_68,resbuf.mark,(size_t)chain);
      for (buf = (nghttp2_buf *)bufs->head; buf != (nghttp2_buf *)0x0;
          buf = (nghttp2_buf *)buf->begin) {
        resbuf.pos = nghttp2_cpymem(resbuf.pos,buf->last,(long)buf->mark - (long)buf->last);
      }
      *out = resbuf.mark;
      bufs_local = (nghttp2_bufs *)chain;
    }
  }
  return (ssize_t)bufs_local;
}

Assistant:

ssize_t nghttp2_bufs_remove(nghttp2_bufs *bufs, uint8_t **out) {
  size_t len;
  nghttp2_buf_chain *chain;
  nghttp2_buf *buf;
  uint8_t *res;
  nghttp2_buf resbuf;

  len = 0;

  for (chain = bufs->head; chain; chain = chain->next) {
    len += nghttp2_buf_len(&chain->buf);
  }

  if (len == 0) {
    res = NULL;
    return 0;
  }

  res = nghttp2_mem_malloc(bufs->mem, len);
  if (res == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_buf_wrap_init(&resbuf, res, len);

  for (chain = bufs->head; chain; chain = chain->next) {
    buf = &chain->buf;
    resbuf.last = nghttp2_cpymem(resbuf.last, buf->pos, nghttp2_buf_len(buf));
  }

  *out = res;

  return (ssize_t)len;
}